

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

bool QFontDatabase::isFixedPitch(QString *family,QString *style)

{
  Type *mutex;
  QtFontFamily *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  parseFontName(family,(QString *)&local_68,(QString *)&local_48);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)family);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_28,mutex);
  QFontDatabasePrivate::ensureFontDatabase();
  pQVar1 = QFontDatabasePrivate::family
                     (&QFontDatabasePrivate::instance::instance,(QString *)&local_48,EnsurePopulated
                     );
  if (pQVar1 == (QtFontFamily *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = (bool)((*(byte *)pQVar1 & 2) >> 1);
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::isFixedPitch(const QString &family,
                                 const QString &style)
{
    Q_UNUSED(style);

    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QtFontFamily *f = d->family(familyName);
    return (f && f->fixedPitch);
}